

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::announce_with_tracker(torrent *this,event_t e)

{
  header_holder_type *phVar1;
  protocol_version pVar2;
  byte bVar3;
  byte fail_limit;
  ushort uVar4;
  node_ptr plVar5;
  pointer pppVar6;
  element_type *peVar7;
  pointer paVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer pcVar10;
  session_interface *psVar11;
  undefined8 uVar12;
  pointer __first;
  pointer __last;
  _Alloc_hider _Var13;
  context *pcVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  time_point32 now;
  uint uVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar20;
  ulong uVar21;
  pointer paVar22;
  pointer paVar23;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  event_t eVar24;
  undefined8 in_RCX;
  undefined7 uVar26;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar25;
  _Tp_alloc_type *__alloc;
  uint extraout_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  size_t __n;
  endpoint *ep;
  endpoint *ep_00;
  peer_connection **c;
  pointer pppVar27;
  string *this_00;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
  _Var28;
  undefined7 in_register_00000031;
  char *pcVar29;
  pointer this_01;
  ulong uVar30;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
  __it;
  long lVar31;
  ulong uVar32;
  optional<long> oVar33;
  protocol_version ih;
  undefined4 local_464;
  pointer local_460;
  announce_entry *local_458;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  shared_ptr<libtorrent::aux::tracker_logger> tl;
  uint local_3fc;
  vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
  listen_socket_states;
  __weak_ptr<libtorrent::aux::request_callback,(__gnu_cxx::_Lock_policy)2> local_388 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_380;
  __weak_ptr<libtorrent::aux::request_callback,(__gnu_cxx::_Lock_policy)2> local_378 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_370;
  tracker_request req;
  _Any_data local_260;
  code *local_250;
  code *local_248;
  tracker_request local_240;
  tracker_request local_138;
  
  phVar1 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  plVar5 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_;
  uVar26 = (undefined7)((ulong)in_RCX >> 8);
  if (plVar5 == (node_ptr)0x0 || plVar5 == &phVar1->super_node) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar29 = "*** announce: no trackers";
  }
  else {
    uVar17 = (uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
    local_464 = (undefined4)CONCAT71(in_register_00000031,e);
    if (e == stopped || (uVar17 >> 0x1a & 1) != 0) {
      iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      iVar18 = session_settings::get_int
                         ((session_settings *)CONCAT44(extraout_var_00,iVar18),0x4002);
      local_464 = (undefined4)CONCAT71(uVar26,3);
      if (0 < iVar18) {
LAB_002d611b:
        tracker_request::tracker_request(&req);
        iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        bVar15 = session_settings::get_bool
                           ((session_settings *)CONCAT44(extraout_var_01,iVar18),0x802e);
        if ((bVar15) && ((this->field_0x5db & 2) != 0)) {
          ::std::__shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&req.filter.
                      super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>,
                     &(this->m_ip_filter).
                      super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>);
        }
        req.private_torrent =
             (bool)((((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_flags).m_val >> 1 & 1);
        req.pid.m_number._M_elems._0_8_ = *(undefined8 *)(this->m_peer_id).m_number._M_elems;
        req.pid.m_number._M_elems._8_8_ = *(undefined8 *)((this->m_peer_id).m_number._M_elems + 2);
        req.pid.m_number._M_elems[4] = (this->m_peer_id).m_number._M_elems[4];
        req.corrupt = this->m_total_failed_bytes;
        req.downloaded =
             *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                       field_0x20 - req.corrupt;
        req.uploaded = *(int64_t *)
                        &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>;
        oVar33 = bytes_left(this);
        req.left = 0x4000;
        if (((undefined1  [16])
             oVar33.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          req.left = oVar33.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
        }
        req.ssl_ctx = (this->m_ssl_ctx)._M_t.
                      super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                      .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
        req.redundant = this->m_total_redundant_bytes;
        iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        bVar15 = session_settings::get_bool
                           ((session_settings *)CONCAT44(extraout_var_02,iVar18),0x801d);
        lVar25 = req.downloaded;
        if (!bVar15) {
          lVar25 = req.downloaded - this->m_total_redundant_bytes;
          req.downloaded = lVar25;
          bVar15 = is_seed(this);
          if (bVar15) {
            pppVar6 = (this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pppVar27 = (this->super_torrent_hot_members).m_connections.
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            .
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; lVar25 = req.downloaded,
                pppVar27 != pppVar6; pppVar27 = pppVar27 + 1) {
              (*((*pppVar27)->super_bandwidth_socket)._vptr_bandwidth_socket[0x1c])();
              if (0 < (int)extraout_EDX) {
                req.downloaded = req.downloaded - (ulong)(extraout_EDX & 0x7fffffff);
                req.redundant = req.redundant + (ulong)(extraout_EDX & 0x7fffffff);
              }
            }
          }
        }
        if (lVar25 < 0) {
          req.downloaded = 0;
        }
        req.event = (event_t)local_464;
        iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        bVar15 = session_settings::get_bool
                           ((session_settings *)CONCAT44(extraout_var_03,iVar18),0x8026);
        if (((!bVar15) &&
            (peVar7 = (this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr, peVar7 != (element_type *)0x0)) &&
           (((peVar7->m_flags).m_val & 2) != 0)) {
          local_248 = ::std::
                      _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3082:33)>
                      ::_M_invoke;
          local_250 = ::std::
                      _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3082:33)>
                      ::_M_manager;
          local_260._M_unused._M_object = this;
          local_260._8_8_ = &req;
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x24])();
          ::std::_Function_base::~_Function_base((_Function_base *)&local_260);
        }
        req.num_want = 0;
        if (req.event != stopped) {
          iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[0x2e])();
          req.num_want = session_settings::get_int
                                   ((session_settings *)CONCAT44(extraout_var_04,iVar18),0x4016);
        }
        bVar15 = info_hash_t::has_v1(&this->m_info_hash);
        bVar16 = info_hash_t::has_v2(&this->m_info_hash);
        supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = bVar16;
        supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = bVar15;
        now = time_now32();
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar18 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
        if ((char)iVar18 != '\0') {
          iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[0x2e])();
          bVar15 = session_settings::get_bool
                             ((session_settings *)CONCAT44(extraout_var_05,iVar18),0x8011);
          iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[0x2e])();
          bVar16 = session_settings::get_bool
                             ((session_settings *)CONCAT44(extraout_var_06,iVar18),0x8012);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,
                     "*** announce: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
                     ,(ulong)bVar15,(ulong)bVar16,
                     (ulong)(uint)(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.
                                  super_size_traits.size_);
        }
        local_3fc = 0xffffffff;
        local_458 = (announce_entry *)phVar1;
LAB_002d64de:
        do {
          local_458 = (announce_entry *)(local_458->list_hook).super_type.super_type.next_;
          if (local_458 == (announce_entry *)phVar1) goto LAB_002d6fbc;
          anon_unknown_135::refresh_endpoint_list
                    ((this->super_torrent_hot_members).m_ses,
                     (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                     (bool)((byte)this->field_0x606 >> 6 & 1),local_458);
          ::std::__cxx11::string::_M_assign((string *)&req.trackerid);
          ::std::__cxx11::string::_M_assign((string *)&req);
          bVar15 = is_i2p_url((string *)&req);
          local_3fc = local_3fc + 1;
          if (bVar15) {
            req.kind.m_val = req.kind.m_val | 2;
          }
          else if ((char)this->field_0x5cc < '\0') {
            iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x2e])();
            bVar15 = session_settings::get_bool
                               ((session_settings *)CONCAT44(extraout_var_07,iVar18),0x8017);
            if (!bVar15) goto LAB_002d64de;
          }
          paVar8 = (local_458->endpoints).
                   super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (this_01 = (local_458->endpoints).
                         super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              __last = listen_socket_states.
                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              __first = listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_start, this_01 != paVar8;
              this_01 = this_01 + 1) {
            lVar31 = (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar25 = 8;
            lVar20 = 0;
            for (__args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar31 >> 7);
                0 < (long)__args;
                __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&__args[-1]._M_weak_count + 3)) {
              p_Var9 = (this_01->socket).m_sock.
                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var9 == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             ((long)&(((announce_state *)
                                      (&(listen_socket_states.
                                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar25)) {
                paVar22 = (pointer)((long)listen_socket_states.
                                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                          ._M_impl.super__Vector_impl_data._M_start - lVar20);
                goto LAB_002d66b8;
              }
              if (p_Var9 == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             ((long)&(((announce_state *)
                                      (&listen_socket_states.
                                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar25)) {
                paVar22 = (pointer)((long)listen_socket_states.
                                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   (0x20 - lVar20));
                goto LAB_002d66b8;
              }
              if (p_Var9 == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             ((long)&(((announce_state *)
                                      (&listen_socket_states.
                                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                        ._M_impl.super__Vector_impl_data._M_start[2].state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar25)) {
                paVar22 = (pointer)((long)listen_socket_states.
                                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   (0x40 - lVar20));
                goto LAB_002d66b8;
              }
              if (p_Var9 == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             ((long)&(((announce_state *)
                                      (&listen_socket_states.
                                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                        ._M_impl.super__Vector_impl_data._M_start[3].state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar25)) {
                paVar22 = (pointer)((long)listen_socket_states.
                                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   (0x60 - lVar20));
                goto LAB_002d66b8;
              }
              lVar20 = lVar20 + -0x80;
              lVar25 = lVar25 + 0x80;
            }
            __args = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar31 + lVar20 >> 5);
            paVar22 = (pointer)((long)listen_socket_states.
                                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                      ._M_impl.super__Vector_impl_data._M_start - lVar20);
            if (__args == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3) {
              __args = (this_01->socket).m_sock.
                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (__args != *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             ((long)&(((announce_state *)
                                      (&(listen_socket_states.
                                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar25)) {
                paVar22 = (pointer)((long)listen_socket_states.
                                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   (0x20 - lVar20));
                goto LAB_002d66a6;
              }
LAB_002d66b8:
              if (paVar22 ==
                  listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002d66c1;
            }
            else {
              if (__args == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
                __args = (this_01->socket).m_sock.
                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
LAB_002d66a6:
                if (__args != (paVar22->socket).m_sock.
                              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi) {
                  paVar22 = paVar22 + 1;
                  goto LAB_002d66b0;
                }
                goto LAB_002d66b8;
              }
              if (__args == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
                __args = (this_01->socket).m_sock.
                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
LAB_002d66b0:
                if (__args != (paVar22->socket).m_sock.
                              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi) {
                  paVar22 = listen_socket_states.
                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                goto LAB_002d66b8;
              }
LAB_002d66c1:
              if (listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                if (lVar31 == 0x7fffffffffffffe0) {
                  ::std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar32 = lVar31 >> 5;
                uVar21 = uVar32;
                if (listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar21 = 1;
                }
                uVar30 = uVar21 + uVar32;
                __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
                if (0x3fffffffffffffe < uVar30) {
                  uVar30 = 0x3ffffffffffffff;
                }
                if (CARRY8(uVar21,uVar32)) {
                  uVar30 = 0x3ffffffffffffff;
                }
                if (uVar30 == 0) {
                  paVar22 = (pointer)0x0;
                }
                else {
                  paVar22 = (pointer)operator_new(uVar30 << 5);
                  __args = extraout_RDX;
                }
                ::std::
                allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>
                ::
                construct<libtorrent::aux::(anonymous_namespace)::announce_state,libtorrent::aux::listen_socket_handle&>
                          ((allocator_type *)(paVar22 + uVar32),(announce_state *)&this_01->socket,
                           (listen_socket_handle *)__args);
                paVar23 = ::std::
                          vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ::_S_relocate(__first,__last,paVar22,__alloc);
                paVar23 = ::std::
                          vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ::_S_relocate(__last,__last,paVar23 + 1,__alloc);
                ::std::
                _Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ::_M_deallocate((_Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                 *)__first,
                                (pointer)((long)listen_socket_states.
                                                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)__first >> 5),__n);
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ._M_impl.super__Vector_impl_data._M_start = paVar22;
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ._M_impl.super__Vector_impl_data._M_finish = paVar23;
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = paVar22 + uVar30;
              }
              else {
                ::std::
                allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>
                ::
                construct<libtorrent::aux::(anonymous_namespace)::announce_state,libtorrent::aux::listen_socket_handle&>
                          ((allocator_type *)
                           listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (announce_state *)&this_01->socket,(listen_socket_handle *)__args);
                paVar23 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ._M_impl.super__Vector_impl_data._M_finish = paVar23;
              }
              paVar22 = paVar23 + -1;
              listen_socket_states.
              super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
              ._M_impl.super__Vector_impl_data._M_finish = paVar23;
            }
            if ((this_01->field_0xb0 & 1) != 0) {
              local_460 = paVar22;
              for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
                pVar2 = (&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar25];
                ih = pVar2;
                if (((supports_protocol.super_array<const_bool,_2UL>._M_elems[pVar2] == true) &&
                    ((((this_01->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                       _M_elems[pVar2].field_0x45 & 1) != 0 || (req.event != stopped)))) &&
                   ((paVar22->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[pVar2].done == false)) {
                  iVar18 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
                  this_00 = &(this_01->info_hashes).
                             super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[pVar2].
                             message;
                  if ((char)iVar18 != '\0') {
                    print_endpoint_abi_cxx11_((string *)&tl,(aux *)this_01,ep);
                    paVar22 = local_460;
                    uVar12 = CONCAT44(tl.
                                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._4_4_,
                                      CONCAT22(tl.
                                               super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr._2_2_,
                                               tl.
                                               super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr._0_2_));
                    pcVar10 = (local_458->url)._M_dataplus._M_p;
                    bVar3 = local_458->tier;
                    uVar17 = (local_460->state).
                             super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                             ._M_elems[pVar2].tier;
                    uVar4 = *(ushort *)((long)(this_00 + 2) + 4);
                    fail_limit = local_458->fail_limit;
                    bVar15 = is_seed(this);
                    bVar15 = announce_infohash::can_announce
                                       ((announce_infohash *)this_00,
                                        (time_point)((long)(int)now.__d.__r * 1000000000),bVar15,
                                        fail_limit);
                    (*(this->super_request_callback)._vptr_request_callback[7])
                              (this,
                               "*** tracker:  (%d) [ep: %s ] \"%s\" [  i->tier: %d tier: %d working: %d limit: %d can: %d sent: %d ]"
                               ,(ulong)local_3fc,uVar12,pcVar10,(ulong)bVar3,(ulong)uVar17,
                               (ulong)((uVar4 & 0x7f) == 0),(ulong)fail_limit,(ulong)bVar15,
                               (ulong)(paVar22->state).
                                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                      ._M_elems[pVar2].sent_announce);
                    ::std::__cxx11::string::~string((string *)&tl);
                  }
                  iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                             _vptr_session_logger[0x2e])();
                  bVar15 = session_settings::get_bool
                                     ((session_settings *)CONCAT44(extraout_var_08,iVar18),0x8011);
                  if (bVar15) {
                    iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                               _vptr_session_logger[0x2e])();
                    bVar15 = session_settings::get_bool
                                       ((session_settings *)CONCAT44(extraout_var_09,iVar18),0x8012)
                    ;
                    if (((!bVar15) &&
                        ((local_460->state).
                         super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                         ._M_elems[pVar2].sent_announce == true)) &&
                       (iVar18 = (local_460->state).
                                 super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                 ._M_elems[pVar2].tier, paVar22 = local_460,
                       (int)(uint)local_458->tier <= iVar18 && iVar18 != 0x7fffffff))
                    goto LAB_002d6e6c;
                  }
                  if (((local_460->state).
                       super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                       ._M_elems[pVar2].tier < (int)(uint)local_458->tier) &&
                     ((local_460->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[pVar2].sent_announce == true)) {
                    iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                               _vptr_session_logger[0x2e])();
                    bVar15 = session_settings::get_bool
                                       ((session_settings *)CONCAT44(extraout_var_10,iVar18),0x8011)
                    ;
                    paVar22 = local_460;
                    if (!bVar15) goto LAB_002d6e6c;
                  }
                  if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                    (local_460->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[pVar2].tier = (uint)local_458->tier;
                    (local_460->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[pVar2].sent_announce = false;
                  }
                  bVar15 = is_seed(this);
                  bVar15 = announce_infohash::can_announce
                                     ((announce_infohash *)this_00,
                                      (time_point)((long)(int)now.__d.__r * 1000000000),bVar15,
                                      local_458->fail_limit);
                  if (bVar15) {
                    req.event = (event_t)local_464;
                    if (req.event == none) {
                      eVar24 = started;
                      if ((*(uint *)((long)(this_00 + 2) + 4) >> 8 & 1) == 0) {
LAB_002d6a90:
                        req.event = eVar24;
                      }
                      else if (((*(uint *)((long)(this_00 + 2) + 4) >> 9 & 1) == 0) &&
                              ((this->field_0x606 & 0x40) == 0)) {
                        bVar15 = is_seed(this);
                        eVar24 = completed;
                        if (bVar15) goto LAB_002d6a90;
                      }
                    }
                    req.triggered_manually =
                         (bool)((byte)((ushort)*(undefined2 *)((long)(this_00 + 2) + 4) >> 10) & 1);
                    *(undefined1 *)((long)(this_00 + 2) + 5) =
                         *(undefined1 *)((long)(this_00 + 2) + 5) & 0xfb;
                    req.key = tracker_key(this);
                    ::std::__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    ::operator=((__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 *)&req.outgoing_socket,
                                (__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 *)&this_01->socket);
                    info_hash_t::get((sha1_hash *)&tl,
                                     &((this->super_torrent_hot_members).m_torrent_file.
                                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->m_info_hash,ih);
                    req.info_hash.m_number._M_elems[0] =
                         CONCAT22(tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._2_2_,
                                  tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._0_2_);
                    req.info_hash.m_number._M_elems[1] =
                         tl.
                         super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_;
                    req.info_hash.m_number._M_elems[2] =
                         (uint)tl.
                               super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                    req.info_hash.m_number._M_elems[3] =
                         tl.
                         super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi._4_4_;
                    iVar18 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
                    pcVar14 = req.ssl_ctx;
                    _Var13 = req.url._M_dataplus;
                    if ((char)iVar18 != '\0') {
                      pcVar29 = "";
                      if (req.event == started) {
                        pcVar29 = "started";
                      }
                      if (req.event == stopped) {
                        pcVar29 = "stopped";
                      }
                      uVar17 = *(uint *)&(this->super_torrent_hot_members).field_0x48;
                      iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[0x20])();
                      uVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[0x21])();
                      uVar4 = *(ushort *)((long)(this_00 + 2) + 4);
                      print_endpoint_abi_cxx11_((string *)&tl,(aux *)this_01,ep_00);
                      (*(this->super_request_callback)._vptr_request_callback[7])
                                (this,
                                 "==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p port: %d ssl-port: %d fails: %d upd: %d ep: %s"
                                 ,_Var13._M_p,pcVar29,(ulong)(uVar17 >> 0x1a & 1),pcVar14,
                                 (short)iVar18,(ulong)(uVar19 & 0xffff),(ulong)(uVar4 & 0x7f),
                                 (ulong)(uVar4 >> 7 & 1),
                                 CONCAT44(tl.
                                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          CONCAT22(tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._2_2_,
                                                  tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_2_)));
                      ::std::__cxx11::string::~string((string *)&tl);
                    }
                    if ((((this->super_torrent_hot_members).field_0x4b & 4) == 0) ||
                       (iVar18 = (**(((this->super_torrent_hot_members).m_ses)->super_session_logger
                                    )._vptr_session_logger)(), (char)iVar18 == '\0')) {
                      psVar11 = (this->super_torrent_hot_members).m_ses;
                      tracker_request::tracker_request(&local_240,&req);
                      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr<libtorrent::aux::torrent,void>
                                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>
                                  *)&tl,(__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                         *)&this->
                                            super_enable_shared_from_this<libtorrent::aux::torrent>)
                      ;
                      ::std::
                      __weak_ptr<libtorrent::aux::request_callback,(__gnu_cxx::_Lock_policy)2>::
                      __weak_ptr<libtorrent::aux::torrent,void>
                                (local_378,
                                 (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                  *)&tl);
                      (*(psVar11->super_session_logger)._vptr_session_logger[0x2f])
                                (psVar11,&local_240,local_378);
                      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_370);
                      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      tracker_request::~tracker_request(&local_240);
                    }
                    else {
                      ::std::
                      make_shared<libtorrent::aux::tracker_logger,libtorrent::aux::session_interface&>
                                ((session_interface *)
                                 &tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                );
                      psVar11 = (this->super_torrent_hot_members).m_ses;
                      tracker_request::tracker_request(&local_138,&req);
                      ::std::
                      __weak_ptr<libtorrent::aux::request_callback,(__gnu_cxx::_Lock_policy)2>::
                      __weak_ptr<libtorrent::aux::tracker_logger,void>
                                (local_388,
                                 &tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                );
                      (*(psVar11->super_session_logger)._vptr_session_logger[0x2f])
                                (psVar11,&local_138,local_388);
                      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_380);
                      tracker_request::~tracker_request(&local_138);
                      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                    *(undefined1 *)((long)(this_00 + 2) + 4) =
                         *(undefined1 *)((long)(this_00 + 2) + 4) | 0x80;
                    (((time_point32 *)((error_code *)(this_00 + 1) + 1))->__d).__r =
                         (rep_conflict)now.__d.__r;
                    ((time_point32 *)((error_code *)(this_00 + 1) + 1))[1].__d.__r =
                         (rep_conflict)now.__d.__r;
                    iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                               _vptr_session_logger[5])();
                    if ((*(uint *)(CONCAT44(extraout_var_13,iVar18) + 0x68) & 0x10) != 0) {
                      iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[5])();
                      get_handle((torrent *)&tl);
                      alert_manager::
                      emplace_alert<libtorrent::tracker_announce_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string&,libtorrent::protocol_version_const&,libtorrent::event_t&>
                                ((alert_manager *)CONCAT44(extraout_var_14,iVar18),
                                 (torrent_handle *)&tl,&this_01->local_endpoint,&req.url,&ih,
                                 &req.event);
                      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                                 &tl.
                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                    (local_460->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[pVar2].sent_announce = true;
                    paVar22 = local_460;
                    if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                      iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[0x2e])();
                      bVar15 = session_settings::get_bool
                                         ((session_settings *)CONCAT44(extraout_var_15,iVar18),
                                          0x8012);
                      paVar22 = local_460;
                      if (!bVar15) {
                        iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x2e])();
                        bVar15 = session_settings::get_bool
                                           ((session_settings *)CONCAT44(extraout_var_16,iVar18),
                                            0x8011);
LAB_002d6e56:
                        paVar22 = local_460;
                        if (bVar15 == false) {
                          (local_460->state).
                          super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                          ._M_elems[pVar2].done = true;
                        }
                      }
                    }
                  }
                  else {
                    paVar22 = local_460;
                    if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                      (local_460->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[pVar2].sent_announce = true;
                      iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[0x2e])();
                      bVar15 = session_settings::get_bool
                                         ((session_settings *)CONCAT44(extraout_var_11,iVar18),
                                          0x8012);
                      paVar22 = local_460;
                      if (!bVar15) {
                        iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x2e])();
                        bVar15 = session_settings::get_bool
                                           ((session_settings *)CONCAT44(extraout_var_12,iVar18),
                                            0x8011);
                        goto LAB_002d6e56;
                      }
                    }
                  }
                }
LAB_002d6e6c:
              }
            }
          }
          tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
          _0_2_ = supports_protocol.super_array<const_bool,_2UL>._M_elems;
          lVar20 = (long)listen_socket_states.
                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)listen_socket_states.
                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          __it._M_current =
               listen_socket_states.
               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
               ._M_impl.super__Vector_impl_data._M_start;
          for (lVar25 = lVar20 >> 7; _Var28._M_current = __it._M_current, 0 < lVar25;
              lVar25 = lVar25 + -1) {
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it);
            if (bVar15) goto LAB_002d6fae;
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it._M_current + 1);
            _Var28._M_current = __it._M_current + 1;
            if (bVar15) goto LAB_002d6fae;
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it._M_current + 2);
            _Var28._M_current = __it._M_current + 2;
            if (bVar15) goto LAB_002d6fae;
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it._M_current + 3);
            _Var28._M_current = __it._M_current + 3;
            if (bVar15) goto LAB_002d6fae;
            __it._M_current = __it._M_current + 4;
            lVar20 = lVar20 + -0x80;
          }
          lVar20 = lVar20 >> 5;
          if (lVar20 == 1) {
LAB_002d6f98:
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it);
            _Var28._M_current = __it._M_current;
            if (!bVar15) {
              _Var28._M_current = __last;
            }
          }
          else if (lVar20 == 2) {
LAB_002d6f6e:
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it);
            _Var28._M_current = __it._M_current;
            if (!bVar15) {
              __it._M_current = __it._M_current + 1;
              goto LAB_002d6f98;
            }
          }
          else {
            if (lVar20 != 3) goto LAB_002d6fbc;
            bVar15 = __gnu_cxx::__ops::
                     _Iter_negate<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::$_2>
                     ::operator()((_Iter_negate<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3310:7)>
                                   *)&tl,__it);
            if (!bVar15) {
              __it._M_current = __it._M_current + 1;
              goto LAB_002d6f6e;
            }
          }
LAB_002d6fae:
          if (_Var28._M_current == __last) {
LAB_002d6fbc:
            update_tracker_timer(this,now);
            ::std::
            vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
            ::~vector(&listen_socket_states);
            tracker_request::~tracker_request(&req);
            return;
          }
        } while( true );
      }
      UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
      pcVar29 = "*** announce: event == stopped && stop_tracker_timeout <= 0";
    }
    else if ((this->field_0x5c0 & 1) == 0) {
      UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
      pcVar29 = "*** announce: event != stopped && !m_announce_to_trackers";
    }
    else {
      if ((uVar17 >> 0x1b & 1) == 0) {
        if (e == none) {
          bVar15 = is_finished(this);
          if (bVar15) {
            bVar15 = is_seed(this);
            local_464 = (undefined4)CONCAT71(extraout_var,!bVar15 << 2);
          }
          else {
            local_464 = 0;
          }
        }
        goto LAB_002d611b;
      }
      UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
      pcVar29 = "*** announce: event != stopped && m_paused";
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,pcVar29);
  return;
}

Assistant:

void torrent::announce_with_tracker(event_t e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e == event_t::stopped || state() != torrent_status::checking_files);
		INVARIANT_CHECK;

		if (m_trackers.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: no trackers");
#endif
			return;
		}

		if (m_abort) e = event_t::stopped;

		// having stop_tracker_timeout <= 0 means that there is
		// no need to send any request to trackers or trigger any
		// related logic when the event is stopped
		if (e == event_t::stopped
			&& settings().get_int(settings_pack::stop_tracker_timeout) <= 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event == stopped && stop_tracker_timeout <= 0");
#endif
			return;
		}

		// if we're not announcing to trackers, only allow
		// stopping
		if (e != event_t::stopped && !m_announce_to_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && !m_announce_to_trackers");
#endif
			return;
		}

		// if we're not allowing peers, there's no point in announcing
		if (e != event_t::stopped && m_paused)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && m_paused");
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused || e == event_t::stopped);

		if (e == event_t::none && is_finished() && !is_seed())
			e = event_t::paused;

		tracker_request req;
		if (settings().get_bool(settings_pack::apply_ip_filter_to_trackers)
			&& m_apply_ip_filter)
		{
			req.filter = m_ip_filter;
		}

		req.private_torrent = m_torrent_file->priv();

		req.pid = m_peer_id;
		req.downloaded = m_stat.total_payload_download() - m_total_failed_bytes;
		req.uploaded = m_stat.total_payload_upload();
		req.corrupt = m_total_failed_bytes;
		req.left = bytes_left().value_or(16 * 1024);
#ifdef TORRENT_SSL_PEERS
		// if this torrent contains an SSL certificate, make sure
		// any SSL tracker presents a certificate signed by it
		req.ssl_ctx = m_ssl_ctx.get();
#endif

		req.redundant = m_total_redundant_bytes;
		// exclude redundant bytes if we should
		if (!settings().get_bool(settings_pack::report_true_downloaded))
		{
			req.downloaded -= m_total_redundant_bytes;

			// if the torrent is complete we know that all incoming pieces will be
			// marked redundant so add them to the redundant count
			// this is mainly needed to cover the case where a torrent has just completed
			// but still has partially downloaded pieces
			// if the incoming pieces are not accounted for it could cause the downloaded
			// amount to exceed the total size of the torrent which upsets some trackers
			if (is_seed())
			{
				for (auto const& c : m_connections)
				{
					TORRENT_INCREMENT(m_iterating_connections);
					auto const pbp = c->downloading_piece_progress();
					if (pbp.bytes_downloaded > 0)
					{
						req.downloaded -= pbp.bytes_downloaded;
						req.redundant += pbp.bytes_downloaded;
					}
				}
			}
		}
		if (req.downloaded < 0) req.downloaded = 0;

		req.event = e;

		// since sending our IPv4/v6 address to the tracker may be sensitive. Only
		// do that if we're not in anonymous mode and if it's a private torrent
		if (!settings().get_bool(settings_pack::anonymous_mode)
			&& m_torrent_file
			&& m_torrent_file->priv())
		{
			m_ses.for_each_listen_socket([&](aux::listen_socket_handle const& s)
			{
				if (s.is_ssl() != is_ssl_torrent()) return;
				tcp::endpoint const ep = s.get_local_endpoint();
				if (ep.address().is_unspecified()) return;
				if (aux::is_v6(ep))
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv6.push_back(ep.address().to_v6());
				}
				else
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv4.push_back(ep.address().to_v4());
				}
			});
		}

		// if we are aborting. we don't want any new peers
		req.num_want = (req.event == event_t::stopped)
			? 0 : settings().get_int(settings_pack::num_want);

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 const now = aux::time_now32();

		// each listen socket gets its own announce state
		// so that each one should get at least one announce
		std::vector<announce_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** announce: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif

		// TODO: it would be nice to raise the abstraction level of the
		// tracker_list or trackers a bit here
		for (auto& ae : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			refresh_endpoint_list(m_ses, is_ssl_torrent(), bool(m_complete_sent), ae);

			// if trackerid is not specified for tracker use default one, probably set explicitly
			req.trackerid = ae.trackerid.empty() ? m_trackerid : ae.trackerid;
			req.url = ae.url;

#if TORRENT_USE_I2P
			if (is_i2p_url(req.url))
			{
				req.kind |= tracker_request::i2p;
			}
			else if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			{
				// if we don't allow mixing normal peers into this i2p
				// torrent, skip this announce
				continue;
			}
#endif

			for (auto& aep : ae.endpoints)
			{
				// do not add code which continues to the next endpoint here!
				// listen_socket_states needs to be populated even if none of the endpoints
				// will be announcing for this tracker
				// otherwise the early bail out when neither announce_to_all_trackers
				// nor announce_to_all_tiers is set may be triggered prematurely

				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](announce_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				announce_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;

				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto& a = aep.info_hashes[ih];

					// if we haven't sent an event=start to the tracker, there's no
					// point in sending an event=stopped
					if (!a.start_sent && req.event == event_t::stopped)
						continue;

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker:  (%d) [ep: %s ] \"%s\" [ "
							" i->tier: %d tier: %d working: %d limit: %d"
							" can: %d sent: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str()
							, ae.url.c_str(), ae.tier, state.tier, a.is_working(), ae.fail_limit
							, a.can_announce(now, is_seed(), ae.fail_limit), state.sent_announce);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.sent_announce
						&& ae.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (ae.tier > state.tier && state.sent_announce
						&& !settings().get_bool(settings_pack::announce_to_all_tiers)) continue;
					if (a.is_working()) { state.tier = ae.tier; state.sent_announce = false; }
					if (!a.can_announce(now, is_seed(), ae.fail_limit))
					{
						// this counts
						if (a.is_working())
						{
							state.sent_announce = true;
							if (!settings().get_bool(settings_pack::announce_to_all_trackers)
								&& !settings().get_bool(settings_pack::announce_to_all_tiers))
							{
								state.done = true;
							}
						}
						continue;
					}

					req.event = e;
					if (req.event == event_t::none)
					{
						if (!a.start_sent) req.event = event_t::started;
						else if (!m_complete_sent
							&& !a.complete_sent
							&& is_seed())
						{
							req.event = event_t::completed;
						}
					}

					req.triggered_manually = a.triggered_manually;
					a.triggered_manually = false;

#if TORRENT_ABI_VERSION == 1
					req.auth = tracker_login();
#endif
					req.key = tracker_key();

					req.outgoing_socket = aep.socket;
					req.info_hash = m_torrent_file->info_hashes().get(ih);

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p "
							"port: %d ssl-port: %d fails: %d upd: %d ep: %s"
							, req.url.c_str()
							, (req.event == event_t::stopped ? "stopped"
								: req.event == event_t::started ? "started" : "")
							, m_abort
#ifdef TORRENT_SSL_PEERS
							, static_cast<void*>(req.ssl_ctx)
#else
							, static_cast<void*>(nullptr)
#endif
							, m_ses.listen_port()
							, m_ses.ssl_listen_port()
							, a.fails
							, a.updating
							, print_endpoint(aep.local_endpoint).c_str());
					}

					// if we're not logging session logs, don't bother creating an
					// observer object just for logging
					if (m_abort && m_ses.should_log())
					{
						auto tl = std::make_shared<aux::tracker_logger>(m_ses);
						m_ses.queue_tracker_request(req, tl);
					}
					else
#endif
					{
						m_ses.queue_tracker_request(req, shared_from_this());
					}

					a.updating = true;
					a.next_announce = now;
					a.min_announce = now;

					if (m_ses.alerts().should_post<tracker_announce_alert>())
					{
						m_ses.alerts().emplace_alert<tracker_announce_alert>(
							get_handle(), aep.local_endpoint, req.url, ih, req.event);
					}

					state.sent_announce = true;
					if (a.is_working()
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
					{
						state.done = true;
					}
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](announce_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}
		update_tracker_timer(now);
	}